

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

FileMetaData * __thiscall
duckdb_parquet::FileMetaData::operator=(FileMetaData *this,FileMetaData *other244)

{
  this->version = other244->version;
  std::vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>::
  operator=(&(this->schema).
             super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
            ,&(other244->schema).
              super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
           );
  this->num_rows = other244->num_rows;
  std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>::operator=
            (&(this->row_groups).
              super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>,
             &(other244->row_groups).
              super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>);
  std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::operator=
            (&(this->key_value_metadata).
              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>,
             &(other244->key_value_metadata).
              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>);
  std::__cxx11::string::_M_assign((string *)&this->created_by);
  std::vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>::operator=
            (&(this->column_orders).
              super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
             ,&(other244->column_orders).
               super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>
            );
  EncryptionAlgorithm::operator=(&this->encryption_algorithm,&other244->encryption_algorithm);
  std::__cxx11::string::_M_assign((string *)&this->footer_signing_key_metadata);
  this->__isset = other244->__isset;
  return this;
}

Assistant:

FileMetaData& FileMetaData::operator=(const FileMetaData& other244) {
  version = other244.version;
  schema = other244.schema;
  num_rows = other244.num_rows;
  row_groups = other244.row_groups;
  key_value_metadata = other244.key_value_metadata;
  created_by = other244.created_by;
  column_orders = other244.column_orders;
  encryption_algorithm = other244.encryption_algorithm;
  footer_signing_key_metadata = other244.footer_signing_key_metadata;
  __isset = other244.__isset;
  return *this;
}